

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipaddress.cxx
# Opt level: O1

int main(void)

{
  int iVar1;
  __sighandler_t p_Var2;
  int *piVar3;
  system_error *this;
  error_category *__ecat;
  long lVar4;
  array<int,_2UL> signals;
  OledI2C oled;
  string local_4c0;
  int local_4a0 [2];
  undefined1 local_498 [1144];
  
  local_4a0[0] = 2;
  local_4a0[1] = 0xf;
  lVar4 = 0;
  do {
    iVar1 = *(int *)(local_498 + lVar4 + -8);
    p_Var2 = signal(iVar1,signalHandler);
    if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
      local_498._0_8_ = local_498 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"installing ","");
      strsignal(iVar1);
      std::__cxx11::string::append(local_498);
      std::__cxx11::string::append(local_498);
      this = (system_error *)__cxa_allocate_exception(0x20);
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      __ecat = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this,iVar1,__ecat,(string *)local_498);
      __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 8);
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"/dev/i2c-1","");
  SSD1306::OledI2C::OledI2C((OledI2C *)local_498,&local_4c0,'<');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if ((anonymous_namespace)::run != 0) {
    do {
      showAddresses((OledI2C *)local_498);
      local_4c0._M_dataplus._M_p = (pointer)0x1;
      local_4c0._M_string_length = 0;
      do {
        iVar1 = nanosleep((timespec *)&local_4c0,(timespec *)&local_4c0);
        if (iVar1 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    } while ((anonymous_namespace)::run != 0);
  }
  SSD1306::OledI2C::clear((OledI2C *)local_498);
  SSD1306::OledI2C::displayUpdate((OledI2C *)local_498);
  SSD1306::OledI2C::~OledI2C((OledI2C *)local_498);
  return 0;
}

Assistant:

int
main()
{
    try
    {
        constexpr std::array<int, 2> signals{SIGINT, SIGTERM};

        for (auto signal : signals)
        {
            if (std::signal(signal, signalHandler) == SIG_ERR)
            {
                std::string what{"installing "};
                what += strsignal(signal);
                what += " signal handler";

                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }
        }

        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        while (run)
        {
            showAddresses(oled);
            constexpr auto oneSecond(std::chrono::seconds(1));
            std::this_thread::sleep_for(oneSecond);
        }

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}